

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

void __thiscall EnvironmentNAVXYTHETALAT::InitializeEnvironment(EnvironmentNAVXYTHETALAT *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  ulong *puVar7;
  long *plVar8;
  long in_RDI;
  ulong uVar9;
  int i;
  int maxsize;
  EnvNAVXYTHETALATHashEntry_t *HashEntry;
  code *local_a8;
  code *local_90;
  code *local_78;
  code *local_60;
  ulong *local_38;
  int local_18;
  undefined4 *local_10;
  
  iVar3 = *(int *)(in_RDI + 0x28) * *(int *)(in_RDI + 0x2c) * *(int *)(in_RDI + 0x30);
  if (iVar3 < 0x5f5e101) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    *(void **)(in_RDI + 0x1b8) = pvVar5;
    for (local_18 = 0; local_18 < iVar3; local_18 = local_18 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0x1b8) + (long)local_18 * 8) = 0;
    }
    *(undefined8 *)(in_RDI + 0x1c8) = 0;
    *(undefined8 *)(in_RDI + 0x1c0) = 0x2e1;
    *(undefined8 *)(in_RDI + 0x1d8) = 0;
    *(undefined8 *)(in_RDI + 0x1d0) = 0x2e9;
    *(undefined4 *)(in_RDI + 400) = 0;
    *(undefined8 *)(in_RDI + 0x198) = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 400) = 0x400000;
    uVar4 = (ulong)*(int *)(in_RDI + 400);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    uVar6 = SUB168(auVar2 * ZEXT816(0x18),0);
    uVar9 = uVar6 + 8;
    if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar6) {
      uVar9 = 0xffffffffffffffff;
    }
    puVar7 = (ulong *)operator_new__(uVar9);
    *puVar7 = uVar4;
    puVar7 = puVar7 + 1;
    if (uVar4 != 0) {
      local_38 = puVar7;
      do {
        std::vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
        vector((vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                *)0x17478d);
        local_38 = local_38 + 3;
      } while (local_38 != puVar7 + uVar4 * 3);
    }
    *(ulong **)(in_RDI + 0x198) = puVar7;
    *(undefined8 *)(in_RDI + 0x1c8) = 0;
    *(undefined8 *)(in_RDI + 0x1c0) = 0x2d1;
    *(undefined8 *)(in_RDI + 0x1d8) = 0;
    *(undefined8 *)(in_RDI + 0x1d0) = 0x2d9;
    *(undefined8 *)(in_RDI + 0x1b8) = 0;
  }
  std::vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::clear
            ((vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              *)0x174807);
  local_60 = *(code **)(in_RDI + 0x1c0);
  plVar8 = (long *)(in_RDI + *(long *)(in_RDI + 0x1c8));
  if (((ulong)local_60 & 1) != 0) {
    local_60 = *(code **)(local_60 + *plVar8 + -1);
  }
  local_10 = (undefined4 *)
             (*local_60)(plVar8,*(undefined4 *)(in_RDI + 0x34),*(undefined4 *)(in_RDI + 0x38),
                         *(undefined4 *)(in_RDI + 0x3c));
  if (local_10 == (undefined4 *)0x0) {
    local_78 = *(code **)(in_RDI + 0x1d0);
    plVar8 = (long *)(in_RDI + *(long *)(in_RDI + 0x1d8));
    if (((ulong)local_78 & 1) != 0) {
      local_78 = *(code **)(local_78 + *plVar8 + -1);
    }
    local_10 = (undefined4 *)
               (*local_78)(plVar8,*(undefined4 *)(in_RDI + 0x34),*(undefined4 *)(in_RDI + 0x38),
                           *(undefined4 *)(in_RDI + 0x3c));
  }
  *(undefined4 *)(in_RDI + 0x130) = *local_10;
  local_90 = *(code **)(in_RDI + 0x1c0);
  plVar8 = (long *)(in_RDI + *(long *)(in_RDI + 0x1c8));
  if (((ulong)local_90 & 1) != 0) {
    local_90 = *(code **)(local_90 + *plVar8 + -1);
  }
  local_10 = (undefined4 *)
             (*local_90)(plVar8,*(undefined4 *)(in_RDI + 0x40),*(undefined4 *)(in_RDI + 0x44),
                         *(undefined4 *)(in_RDI + 0x48));
  if (local_10 == (undefined4 *)0x0) {
    local_a8 = *(code **)(in_RDI + 0x1d0);
    plVar8 = (long *)(in_RDI + *(long *)(in_RDI + 0x1d8));
    if (((ulong)local_a8 & 1) != 0) {
      local_a8 = *(code **)(local_a8 + *plVar8 + -1);
    }
    local_10 = (undefined4 *)
               (*local_a8)(plVar8,*(undefined4 *)(in_RDI + 0x40),*(undefined4 *)(in_RDI + 0x44),
                           *(undefined4 *)(in_RDI + 0x48));
  }
  *(undefined4 *)(in_RDI + 0x134) = *local_10;
  *(undefined1 *)(in_RDI + 0x138) = 1;
  return;
}

Assistant:

void EnvironmentNAVXYTHETALAT::InitializeEnvironment()
{
    EnvNAVXYTHETALATHashEntry_t* HashEntry;

    int maxsize = EnvNAVXYTHETALATCfg.EnvWidth_c * EnvNAVXYTHETALATCfg.EnvHeight_c * EnvNAVXYTHETALATCfg.NumThetaDirs;

    if (maxsize <= SBPL_XYTHETALAT_MAXSTATESFORLOOKUP) {
        SBPL_PRINTF("environment stores states in lookup table\n");

        Coord2StateIDHashTable_lookup = new EnvNAVXYTHETALATHashEntry_t*[maxsize];
        for (int i = 0; i < maxsize; i++) {
            Coord2StateIDHashTable_lookup[i] = NULL;
        }
        GetHashEntry = &EnvironmentNAVXYTHETALAT::GetHashEntry_lookup;
        CreateNewHashEntry = &EnvironmentNAVXYTHETALAT::CreateNewHashEntry_lookup;

        // not using hash table
        HashTableSize = 0;
        Coord2StateIDHashTable = NULL;
    }
    else {
        SBPL_PRINTF("environment stores states in hashtable\n");

        // initialize the map from Coord to StateID
        HashTableSize = 4 * 1024 * 1024; // should be power of two
        Coord2StateIDHashTable = new std::vector<EnvNAVXYTHETALATHashEntry_t*>[HashTableSize];
        GetHashEntry = &EnvironmentNAVXYTHETALAT::GetHashEntry_hash;
        CreateNewHashEntry = &EnvironmentNAVXYTHETALAT::CreateNewHashEntry_hash;

        // not using hash
        Coord2StateIDHashTable_lookup = NULL;
    }

    // initialize the map from StateID to Coord
    StateID2CoordTable.clear();

    // create start state
    if (NULL == (HashEntry = (this->*GetHashEntry)(
            EnvNAVXYTHETALATCfg.StartX_c,
            EnvNAVXYTHETALATCfg.StartY_c,
            EnvNAVXYTHETALATCfg.StartTheta)))
    {
        // have to create a new entry
        HashEntry = (this->*CreateNewHashEntry)(
                EnvNAVXYTHETALATCfg.StartX_c,
                EnvNAVXYTHETALATCfg.StartY_c,
                EnvNAVXYTHETALATCfg.StartTheta);
    }
    EnvNAVXYTHETALAT.startstateid = HashEntry->stateID;

    // create goal state
    if ((HashEntry = (this->*GetHashEntry)(
            EnvNAVXYTHETALATCfg.EndX_c,
            EnvNAVXYTHETALATCfg.EndY_c,
            EnvNAVXYTHETALATCfg.EndTheta)) == NULL)
    {
        // have to create a new entry
        HashEntry = (this->*CreateNewHashEntry)(
                EnvNAVXYTHETALATCfg.EndX_c,
                EnvNAVXYTHETALATCfg.EndY_c,
                EnvNAVXYTHETALATCfg.EndTheta);
    }
    EnvNAVXYTHETALAT.goalstateid = HashEntry->stateID;

    // initialized
    EnvNAVXYTHETALAT.bInitialized = true;
}